

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_binary(amqp_binary value)

{
  LOGGER_LOG p_Var1;
  void *pvVar2;
  uint uVar3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  AMQP_VALUE result;
  amqp_binary value_local;
  
  uVar3 = value.length;
  if ((value.bytes == (void *)0x0) && (uVar3 != 0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_create_binary",0x3d4,1,"NULL bytes with non-zero length");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)REFCOUNT_AMQP_VALUE_DATA_Create();
    if ((AMQP_VALUE_DATA *)l == (AMQP_VALUE_DATA *)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"amqpvalue_create_binary",0x3dd,1,"Could not allocate memory for AMQP value");
      }
    }
    else {
      ((AMQP_VALUE_DATA *)l)->type = AMQP_TYPE_BINARY;
      if (uVar3 == 0) {
        (((AMQP_VALUE_DATA *)l)->value).described_value.descriptor = (AMQP_VALUE)0x0;
      }
      else {
        pvVar2 = malloc((ulong)uVar3);
        (((AMQP_VALUE_DATA *)l)->value).binary_value.bytes = pvVar2;
      }
      (((AMQP_VALUE_DATA *)l)->value).binary_value.length = uVar3;
      if (((((AMQP_VALUE_DATA *)l)->value).described_value.descriptor == (AMQP_VALUE)0x0) &&
         (uVar3 != 0)) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                    ,"amqpvalue_create_binary",0x3f1,1,
                    "Could not allocate memory for binary payload of AMQP value");
        }
        REFCOUNT_AMQP_VALUE_DATA_Destroy((AMQP_VALUE_DATA *)l);
        l = (LOGGER_LOG)0x0;
      }
      else if (uVar3 != 0) {
        memcpy((((AMQP_VALUE_DATA *)l)->value).binary_value.bytes,value.bytes,(ulong)uVar3);
      }
    }
  }
  return (AMQP_VALUE)l;
}

Assistant:

AMQP_VALUE amqpvalue_create_binary(amqp_binary value)
{
    AMQP_VALUE result;
    if ((value.bytes == NULL) &&
        (value.length > 0))
    {
        /* Codes_SRS_AMQPVALUE_01_129: [If value.data is NULL and value.length is positive then amqpvalue_create_binary shall return NULL.] */
        LogError("NULL bytes with non-zero length");
        result = NULL;
    }
    else
    {
        result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
        if (result == NULL)
        {
            /* Codes_SRS_AMQPVALUE_01_128: [If allocating the AMQP_VALUE fails then amqpvalue_create_binary shall return NULL.] */
            LogError("Could not allocate memory for AMQP value");
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_127: [amqpvalue_create_binary shall return a handle to an AMQP_VALUE that stores a sequence of bytes.] */
            result->type = AMQP_TYPE_BINARY;
            if (value.length > 0)
            {
                result->value.binary_value.bytes = malloc(value.length);
            }
            else
            {
                result->value.binary_value.bytes = NULL;
            }

            result->value.binary_value.length = value.length;

            if ((result->value.binary_value.bytes == NULL) && (value.length > 0))
            {
                /* Codes_SRS_AMQPVALUE_01_128: [If allocating the AMQP_VALUE fails then amqpvalue_create_binary shall return NULL.] */
                LogError("Could not allocate memory for binary payload of AMQP value");
                REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                result = NULL;
            }
            else
            {
                if (value.length > 0)
                {
                    (void)memcpy((void*)result->value.binary_value.bytes, value.bytes, value.length);
                }
            }
        }
    }

    return result;
}